

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_soundfile.c
# Opt level: O2

char * soundfile_strerror(int errnum)

{
  char *pcVar1;
  
  if (errnum + 0x3ebU < 4) {
    return &DAT_001a5980 + *(int *)(&DAT_001a5980 + (ulong)(errnum + 0x3ebU) * 4);
  }
  pcVar1 = strerror(errnum);
  return pcVar1;
}

Assistant:

const char* soundfile_strerror(int errnum)
{
    switch (errnum)
    {
        case SOUNDFILE_ERRUNKNOWN:
            return "unknown header format";
        case SOUNDFILE_ERRMALFORMED:
            return "bad header format";
        case SOUNDFILE_ERRVERSION:
            return "unsupported header format version";
        case SOUNDFILE_ERRSAMPLEFMT:
            return "unsupported sample format";
        default: /* C/POSIX error */
            return strerror(errnum);
    }
}